

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O2

bool __thiscall
SqModules::compileScript
          (SqModules *this,vector<char,_std::allocator<char>_> *buf,char *resolved_fn,
          char *requested_fn,HSQOBJECT *bindings,Object *script_closure,string *out_err_msg,
          SqASTData **return_ast)

{
  bool bVar1;
  char *sourcename;
  allocator<char> local_10c1;
  char *local_10c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  char buffer [4096];
  
  local_10c0 = requested_fn;
  Sqrat::Object::Release(script_closure);
  memset(buffer,0,0x1000);
  sourcename = resolved_fn;
  if ((this->compilationOptions).useAbsolutePath == true) {
    sourcename = realpath(resolved_fn,buffer);
    if (sourcename == (char *)0x0) {
      sourcename = resolved_fn;
    }
  }
  bVar1 = compileScriptImpl(this,buf,sourcename,bindings,return_ast);
  if (bVar1) {
    Sqrat::Var<Sqrat::Object>::Var((Var<Sqrat::Object> *)&local_10b8,this->sqvm,-1);
    Sqrat::Object::operator=(script_closure,(Object *)&local_10b8);
    Sqrat::Object::~Object((Object *)&local_10b8);
    sq_pop(this->sqvm,1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1098,"Failed to compile file: ",&local_10c1);
    std::operator+(&local_1078,&local_1098,local_10c0);
    std::operator+(&local_1058,&local_1078," / ");
    std::operator+(&local_10b8,&local_1058,resolved_fn);
    std::__cxx11::string::operator=((string *)out_err_msg,(string *)&local_10b8);
    std::__cxx11::string::~string((string *)&local_10b8);
    std::__cxx11::string::~string((string *)&local_1058);
    std::__cxx11::string::~string((string *)&local_1078);
    std::__cxx11::string::~string((string *)&local_1098);
  }
  return bVar1;
}

Assistant:

bool SqModules::compileScript(const std::vector<char> &buf, const char *resolved_fn, const char *requested_fn,
                                                        const HSQOBJECT *bindings,
                                                        Sqrat::Object &script_closure, string &out_err_msg,
                                                        SQCompilation::SqASTData **return_ast)
{
  script_closure.Release();

  const char *filePath = resolved_fn;
  char buffer[MAX_PATH_LENGTH] = {0};

  if (compilationOptions.useAbsolutePath) {
    const char *r = computeAbsolutePath(resolved_fn, buffer, MAX_PATH_LENGTH);
    if (r)
      filePath = r;
  }

  if (!compileScriptImpl(buf, filePath, bindings, return_ast))
  {
    out_err_msg = string("Failed to compile file: ") + requested_fn + " / " + resolved_fn;
    return false;
  }

  script_closure = Sqrat::Var<Sqrat::Object>(sqvm, -1).value;
  sq_pop(sqvm, 1);

  return true;
}